

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall amrex::MLEBABecLap::setEBHomogDirichlet(MLEBABecLap *this,int amrlev,MultiFab *beta)

{
  undefined8 uVar1;
  pointer puVar2;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar3;
  long lVar4;
  long *plVar5;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  uint uVar6;
  MLEBABecLap *pMVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  FabType FVar11;
  EBFArrayBoxFactory *this_01;
  pointer *ppbVar12;
  ulong uVar13;
  element_type *peVar14;
  int iVar15;
  uint32_t *puVar16;
  int iVar17;
  long lVar18;
  int mglev;
  ulong uVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  long lVar23;
  bool bVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Periodicity PVar27;
  int ncomp;
  int ngrow;
  MFIter mfi;
  long local_250;
  uint local_244;
  long local_240;
  ulong local_238;
  size_t local_230;
  MLEBABecLap *local_228;
  long local_220;
  FabArray<amrex::EBCellFlagFab> *local_218;
  ulong local_210;
  long local_208;
  long local_200;
  Location local_1f4;
  uint local_1f0;
  int local_1ec;
  long local_1e8;
  Box local_1dc;
  Array4<double> local_1c0;
  long local_180;
  undefined1 local_178 [88];
  element_type *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  long local_110;
  int local_108;
  int local_104;
  int local_100;
  undefined1 local_e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_d8;
  int local_c0;
  Vector<int,_std::allocator<int>_> *local_a8;
  Array4<const_amrex::EBCellFlag> local_88;
  MFItInfo local_44;
  
  local_244 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_1f0 = (beta->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  local_1f4 = this->m_phi_loc;
  local_228 = this;
  local_178._64_8_ = beta;
  if (local_1f0 != local_244 && local_1f0 != 1) {
    Assert_host("beta_ncomp == 1 || beta_ncomp == ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
                ,399,(char *)0x0);
  }
  pMVar7 = local_228;
  lVar21 = (long)amrlev;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(local_228->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    local_1c0.p._0_4_ = (uint)(local_1f4 == CellCentroid);
    local_e8._1_7_ = 0;
    local_e8[0] = 1;
    local_e8._8_4_ = 0;
    local_e8._12_4_ = 0;
    vStack_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              ((BoxArray *)local_178,
               *(DistributionMapping **)
                &(local_228->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar21].
                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               *(int **)&(local_228->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                         super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar21].
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ,(int *)&local_244,(MFInfo *)&local_1c0,(FabFactory<amrex::FArrayBox> *)local_e8);
    uVar1 = local_178._0_8_;
    puVar2 = (pMVar7->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_178._0_8_ = (double *)0x0;
    tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar2[lVar21]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar2[lVar21]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)uVar1;
    if (tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    if ((double *)local_178._0_8_ != (double *)0x0) {
      (**(code **)((long)*(double *)local_178._0_8_ + 8))();
    }
    local_178._0_8_ = (MultiFab *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_d8);
  }
  local_1e8 = lVar21;
  if (**(long **)&(local_228->m_eb_b_coeffs).
                  super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar21].
                  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      == 0) {
    lVar20 = 0;
    lVar23 = 0;
    for (lVar18 = 0; pMVar7 = local_228,
        lVar18 < (local_228->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_1e8]; lVar18 = lVar18 + 1) {
      local_1c0.p._0_4_ = 0;
      local_e8._1_7_ = 0;
      local_e8[0] = 1;
      vStack_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      vStack_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                ((BoxArray *)local_178,
                 (DistributionMapping *)
                 (*(long *)&(local_228->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids
                            .
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar21].
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> +
                 lVar23),(int *)(*(long *)&(local_228->super_MLCellABecLap).super_MLCellLinOp.
                                           super_MLLinOp.m_dmap.
                                           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                           .
                                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                + lVar20),(int *)&local_244,(MFInfo *)&local_1c0,
                 (FabFactory<amrex::FArrayBox> *)local_e8);
      uVar1 = local_178._0_8_;
      lVar4 = *(long *)&(pMVar7->m_eb_b_coeffs).
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar21].
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ;
      local_178._0_8_ = (double *)0x0;
      plVar5 = *(long **)(lVar4 + lVar18 * 8);
      *(undefined8 *)(lVar4 + lVar18 * 8) = uVar1;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))();
      }
      if ((double *)local_178._0_8_ != (double *)0x0) {
        (**(code **)((long)*(double *)local_178._0_8_ + 8))();
      }
      local_178._0_8_ = (MultiFab *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_d8);
      lVar23 = lVar23 + 0x68;
      lVar20 = lVar20 + 0x10;
    }
  }
  lVar18 = **(long **)&(local_228->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar21].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  local_180 = lVar21 * 0x18;
  if (lVar18 == 0) {
    local_218 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    lVar21 = local_1e8;
  }
  else {
    local_218 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar18,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    lVar21 = local_1e8;
    if (this_01 != (EBFArrayBoxFactory *)0x0) {
      local_218 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    }
  }
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_006ddef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_e8,
                 (FabArrayBase *)
                 (local_228->m_eb_phi).
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 &local_44);
  local_178._72_8_ = (element_type *)0x0;
  if (0 < (int)local_1f0) {
    local_178._72_8_ = ZEXT48(local_1f0);
  }
  while ((int)vStack_d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage < local_c0) {
    MFIter::tilebox(&local_1dc,(MFIter *)local_e8);
    pMVar7 = local_228;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)local_178,
               (FabArray<amrex::FArrayBox> *)
               (local_228->m_eb_phi).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
               (MFIter *)local_e8);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_1c0,
               (FabArray<amrex::FArrayBox> *)
               **(undefined8 **)
                 ((long)&(((pMVar7->m_eb_b_coeffs).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_180),(MFIter *)local_e8);
    if (local_218 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      bVar24 = true;
    }
    else {
      ppbVar12 = &vStack_d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_a8 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar12 = (pointer *)
                   ((local_a8->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start +
                   (int)vStack_d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      FVar11 = EBCellFlagFab::getType
                         ((local_218->m_fabs_v).
                          super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar12],&local_1dc);
      bVar24 = (uint)(FVar11 + singlevalued) < 2;
    }
    iVar10 = local_1dc.bigend.vect[1];
    iVar9 = local_1dc.bigend.vect[0];
    iVar8 = local_1dc.smallend.vect[0];
    local_1ec = local_1dc.smallend.vect[2];
    local_240 = CONCAT44(local_240._4_4_,local_1dc.bigend.vect[2]);
    local_200 = (long)local_1dc.smallend.vect[0] << 3;
    local_220 = CONCAT44(local_220._4_4_,local_1dc.smallend.vect[1]);
    local_208 = (long)local_1dc.smallend.vect[1];
    local_230 = (ulong)(uint)(local_1dc.bigend.vect[0] - local_1dc.smallend.vect[0]) * 8 + 8;
    uVar6 = local_244;
    if ((int)local_244 < 1) {
      uVar6 = 0;
    }
    local_210 = (ulong)uVar6;
    local_250 = 0;
    for (local_238 = 0; iVar17 = local_1ec, local_238 != local_210; local_238 = local_238 + 1) {
      for (; iVar17 <= (int)local_240; iVar17 = iVar17 + 1) {
        lVar21 = local_178._8_8_ * 8;
        pvVar22 = (void *)(local_178._0_8_ +
                          local_178._24_8_ * local_250 +
                          (local_208 - (int)local_178._36_4_) * lVar21 +
                          (long)(iVar17 - local_178._40_4_) * local_178._16_8_ * 8 +
                          (long)(int)local_178._32_4_ * -8 + local_200);
        for (iVar15 = (int)local_220; iVar15 <= iVar10; iVar15 = iVar15 + 1) {
          if (iVar8 <= iVar9) {
            memset(pvVar22,0,local_230);
          }
          pvVar22 = (void *)((long)pvVar22 + lVar21);
        }
      }
      local_250 = local_250 + 8;
    }
    if (bVar24) {
      local_250 = 0;
      uVar13 = 0;
      while (iVar17 = local_1ec, uVar13 != local_210) {
        for (; local_238 = uVar13, iVar17 <= (int)local_240; iVar17 = iVar17 + 1) {
          lVar21 = local_1c0.jstride * 8;
          pvVar22 = (void *)(local_1c0.nstride * local_250 +
                             (local_208 - local_1c0.begin.y) * lVar21 +
                             (iVar17 - local_1c0.begin.z) * local_1c0.kstride * 8 +
                             (long)local_1c0.begin.x * -8 +
                            CONCAT44(local_1c0.p._4_4_,(uint)local_1c0.p) + local_200);
          for (iVar15 = (int)local_220; iVar15 <= iVar10; iVar15 = iVar15 + 1) {
            if (iVar8 <= iVar9) {
              memset(pvVar22,0,local_230);
            }
            pvVar22 = (void *)((long)pvVar22 + lVar21);
          }
          uVar13 = local_238;
        }
        local_250 = local_250 + 8;
        uVar13 = local_238 + 1;
      }
    }
    else {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)(local_178 + 0x50),
                 (FabArray<amrex::FArrayBox> *)local_178._64_8_,(MFIter *)local_e8);
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (&local_88,local_218,(MFIter *)local_e8);
      local_230 = (size_t)local_1dc.smallend.vect[0];
      local_208 = (long)local_1dc.smallend.vect[1];
      local_210 = (ulong)local_1dc.smallend.vect[2];
      local_200 = CONCAT44(local_200._4_4_,local_1dc.bigend.vect[2]);
      if (local_1f0 == local_244) {
        local_220 = local_230 * 8;
        local_238 = local_230 * 4;
        local_240 = 0;
        for (peVar14 = (element_type *)0x0; uVar13 = local_210,
            peVar14 != (element_type *)local_178._72_8_;
            peVar14 = (element_type *)
                      ((long)&(peVar14->m_abox).
                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start + 1)) {
          for (; (int)uVar13 <= local_1dc.bigend.vect[2]; uVar13 = uVar13 + 1) {
            puVar16 = (uint32_t *)
                      ((long)&local_88.p
                              [local_230 +
                               ((uVar13 - (long)local_88.begin.z) * local_88.kstride -
                               (long)local_88.begin.x)].flag +
                      (local_208 - local_88.begin.y) * local_88.jstride * 4);
            for (lVar21 = local_208; lVar21 <= local_1dc.bigend.vect[1]; lVar21 = lVar21 + 1) {
              if (local_1dc.smallend.vect[0] <= local_1dc.bigend.vect[0]) {
                lVar18 = 0;
                do {
                  uVar25 = 0;
                  uVar26 = 0;
                  if ((puVar16[lVar18] & 3) == 1) {
                    uVar1 = *(undefined8 *)
                             (local_178._80_8_ +
                             lVar18 * 8 +
                             local_110 * local_240 +
                             (lVar21 - local_104) * (long)local_120 * 8 +
                             (uVar13 - (long)local_100) * (long)local_118._M_pi * 8 +
                             (long)local_108 * -8 + local_220);
                    uVar25 = (undefined4)uVar1;
                    uVar26 = (undefined4)((ulong)uVar1 >> 0x20);
                  }
                  *(ulong *)(local_1c0.nstride * local_240 +
                             (lVar21 - local_1c0.begin.y) * local_1c0.jstride * 8 +
                             (uVar13 - (long)local_1c0.begin.z) * local_1c0.kstride * 8 +
                             (long)local_1c0.begin.x * -8 +
                             CONCAT44(local_1c0.p._4_4_,(uint)local_1c0.p) + local_220 + lVar18 * 8)
                       = CONCAT44(uVar26,uVar25);
                  lVar18 = lVar18 + 1;
                } while ((local_1dc.bigend.vect[0] - local_1dc.smallend.vect[0]) + 1 != (int)lVar18)
                ;
              }
              puVar16 = puVar16 + local_88.jstride;
            }
          }
          local_240 = local_240 + 8;
        }
      }
      else {
        uVar6 = local_244;
        if ((int)local_244 < 1) {
          uVar6 = 0;
        }
        local_238 = (ulong)uVar6;
        local_220 = local_230 * 4;
        local_240 = 0;
        for (uVar13 = 0; uVar19 = local_210, uVar13 != local_238; uVar13 = uVar13 + 1) {
          for (; (int)uVar19 <= local_1dc.bigend.vect[2]; uVar19 = uVar19 + 1) {
            puVar16 = (uint32_t *)
                      ((long)&local_88.p
                              [local_230 +
                               ((uVar19 - (long)local_88.begin.z) * local_88.kstride -
                               (long)local_88.begin.x)].flag +
                      (local_208 - local_88.begin.y) * local_88.jstride * 4);
            for (lVar21 = local_208; lVar21 <= local_1dc.bigend.vect[1]; lVar21 = lVar21 + 1) {
              if (local_1dc.smallend.vect[0] <= local_1dc.bigend.vect[0]) {
                lVar18 = 0;
                do {
                  uVar25 = 0;
                  uVar26 = 0;
                  if ((puVar16[lVar18] & 3) == 1) {
                    uVar1 = *(undefined8 *)
                             (local_178._80_8_ +
                             lVar18 * 8 +
                             (lVar21 - local_104) * (long)local_120 * 8 +
                             (uVar19 - (long)local_100) * (long)local_118._M_pi * 8 +
                             (long)local_108 * -8 + local_230 * 8);
                    uVar25 = (undefined4)uVar1;
                    uVar26 = (undefined4)((ulong)uVar1 >> 0x20);
                  }
                  *(ulong *)(local_1c0.nstride * local_240 +
                             (lVar21 - local_1c0.begin.y) * local_1c0.jstride * 8 +
                             (uVar19 - (long)local_1c0.begin.z) * local_1c0.kstride * 8 +
                             (long)local_1c0.begin.x * -8 +
                             CONCAT44(local_1c0.p._4_4_,(uint)local_1c0.p) + local_230 * 8 +
                            lVar18 * 8) = CONCAT44(uVar26,uVar25);
                  lVar18 = lVar18 + 1;
                } while ((local_1dc.bigend.vect[0] - local_1dc.smallend.vect[0]) + 1 != (int)lVar18)
                ;
              }
              puVar16 = puVar16 + local_88.jstride;
            }
          }
          local_240 = local_240 + 8;
        }
      }
    }
    MFIter::operator++((MFIter *)local_e8);
    lVar21 = local_1e8;
  }
  MFIter::~MFIter((MFIter *)local_e8);
  if (local_1f4 == CellCentroid) {
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (local_228->m_eb_phi).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    PVar27 = Geometry::periodicity
                       (*(Geometry **)
                         ((long)&(((local_228->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                                   m_geom.
                                   super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_180));
    local_e8[0] = (undefined1)PVar27.period.vect[0];
    local_e8._1_7_ = PVar27.period.vect._1_7_;
    local_e8._8_4_ = PVar27.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(Periodicity *)local_e8,
               false);
  }
  return;
}

Assistant:

void
MLEBABecLap::setEBHomogDirichlet (int amrlev, const MultiFab& beta)
{
    const int ncomp = getNComp();
    const int beta_ncomp = beta.nComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    AMREX_ALWAYS_ASSERT(beta_ncomp == 1 || beta_ncomp == ncomp);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*m_eb_phi[amrlev], mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phifab = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            phifab(i,j,k,n) = 0.0;
        });
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& betain = beta.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            if (beta_ncomp == ncomp) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        betaout(i,j,k,n) = betain(i,j,k,n);
                    } else {
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        betaout(i,j,k,n) = betain(i,j,k,0);
                    } else {
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            }
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}